

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O3

void __thiscall kratos::PortLegalityFixVisitor::visit(PortLegalityFixVisitor *this,Generator *gen)

{
  VarType VVar1;
  Generator *pGVar2;
  undefined8 uVar3;
  long *plVar4;
  element_type *peVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  Generator *pGVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar9;
  _Rb_tree_node_base *p_Var10;
  InternalException *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  undefined8 *puVar12;
  undefined1 local_f0 [8];
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  sinks;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_names;
  undefined1 local_80 [8];
  shared_ptr<kratos::Expr> expr;
  pointer local_68;
  undefined1 local_60 [8];
  shared_ptr<kratos::SwitchStmt> case_;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pGVar2 = gen->parent_generator_;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&sinks._M_h._M_single_bucket,&(gen->ports_)._M_t);
  p_Var10 = port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  pGVar8 = gen;
  if (port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)&port_names) {
    do {
      port_names._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pGVar8;
      Generator::get_port((Generator *)
                          &expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount,(string *)gen);
      if (*(int *)&expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi[0x27]._vptr__Sp_counted_base == 0) {
        iVar7 = (*(expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_vptr__Sp_counted_base[0xe])();
        uVar3 = *(undefined8 *)(CONCAT44(extraout_var,iVar7) + 0x10);
        (*(expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base[0xe])();
        std::
        _Hashtable<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _Hashtable<std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,true,false>>
                  ((_Hashtable<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_f0,uVar3,0,0,local_60,&local_40,local_80);
        for (puVar12 = (undefined8 *)sinks._M_h._M_bucket_count; puVar12 != (undefined8 *)0x0;
            puVar12 = (undefined8 *)*puVar12) {
          pGVar8 = Stmt::generator_parent((Stmt *)puVar12[1]);
          if (pGVar8 == pGVar2) {
            iVar7 = (*(expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      ._M_pi)->_vptr__Sp_counted_base[0x10])();
            if (*(long *)(CONCAT44(extraout_var_00,iVar7) + 0x18) != 0) {
              std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<kratos::Var,void>
                        ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
                         local_40._M_local_buf,
                         (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                         (*(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_00,iVar7) + 0x10) + 8)
                                   + 200) + 0x68));
              pGVar8 = (Generator *)(**(code **)(*(long *)local_40._0_8_ + 0x68))();
              if (pGVar8 != pGVar2) {
                this_00 = (InternalException *)__cxa_allocate_exception(0x10);
                local_60 = (undefined1  [8])
                           &case_.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_60,"Invalid src generator","");
                InternalException::InternalException(this_00,(string *)local_60);
                __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              iVar7 = (*(expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_vptr__Sp_counted_base[0xd])();
              std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<kratos::Var,void>
                        ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)local_60,
                         (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                         (*(long *)(puVar12[1] + 0xc0) + 0x68));
              bVar6 = Generator::is_auxiliary_var
                                ((Generator *)CONCAT44(extraout_var_01,iVar7),
                                 (shared_ptr<kratos::Var> *)local_60);
              if (case_.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           case_.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
              }
              plVar4 = (long *)puVar12[1];
              if (bVar6) {
                lVar9 = (**(code **)(*plVar4 + 0x20))();
                if (*(int *)(lVar9 + 0x78) == 0) {
                  Stmt::as<kratos::IfStmt>((Stmt *)local_60);
                  peVar5 = (((shared_ptr<kratos::Var> *)((long)local_60 + 0xc0))->
                           super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                  p_Var11 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_60 + 200))->
                            _M_pi;
                  if (p_Var11 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (peVar5->type_ != Expression) goto LAB_00243455;
LAB_00243460:
                    bVar6 = true;
                    p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  }
                  else {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
                    }
                    VVar1 = peVar5->type_;
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
                    if (VVar1 != Expression) {
LAB_00243455:
                      IfStmt::set_predicate((IfStmt *)local_60,(shared_ptr<kratos::Var> *)&local_40)
                      ;
                      goto LAB_002434dc;
                    }
                    p_Var11 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_60 + 200))
                              ->_M_pi;
                    if (p_Var11 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                    goto LAB_00243460;
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
                    }
                    bVar6 = false;
                  }
                  Var::as<kratos::Expr>((Var *)local_80);
                  if (!bVar6) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
                  }
                  change_var_expr((shared_ptr<kratos::Expr> *)local_80,
                                  (Var *)expr.
                                         super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi,(Var *)local_40._0_8_,false);
                }
                else {
                  Stmt::as<kratos::SwitchStmt>((Stmt *)local_60);
                  peVar5 = (((shared_ptr<kratos::Var> *)((long)local_60 + 0xc0))->
                           super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                  p_Var11 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_60 + 200))->
                            _M_pi;
                  if (p_Var11 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (peVar5->type_ != Expression) goto LAB_002433f1;
LAB_002433ff:
                    bVar6 = true;
                    p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  }
                  else {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
                    }
                    VVar1 = peVar5->type_;
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
                    if (VVar1 != Expression) {
LAB_002433f1:
                      SwitchStmt::set_target
                                ((SwitchStmt *)local_60,(shared_ptr<kratos::Var> *)&local_40);
                      goto LAB_002434dc;
                    }
                    p_Var11 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_60 + 200))
                              ->_M_pi;
                    if (p_Var11 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                    goto LAB_002433ff;
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
                    }
                    bVar6 = false;
                  }
                  Var::as<kratos::Expr>((Var *)local_80);
                  if (!bVar6) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
                  }
                  change_var_expr((shared_ptr<kratos::Expr> *)local_80,
                                  (Var *)expr.
                                         super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi,(Var *)local_40._0_8_,false);
                }
                if (expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                    (element_type *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
                }
LAB_002434dc:
                if (case_.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    != (element_type *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             case_.
                             super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
                }
              }
              else {
                if (*(int *)(plVar4[0x19] + 0x168) == 1) {
                  Var::as<kratos::Expr>((Var *)local_60);
                  change_var_expr((shared_ptr<kratos::Expr> *)local_60,
                                  (Var *)expr.
                                         super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi,(Var *)local_40._0_8_,false);
                  goto LAB_002434dc;
                }
                plVar4[0x19] = local_40._0_8_;
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_);
              }
            }
          }
        }
        std::
        _Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_f0);
        gen = (Generator *)port_names._M_t._M_impl.super__Rb_tree_header._M_node_count;
      }
      if (local_68 != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68);
      }
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
      pGVar8 = (Generator *)port_names._M_t._M_impl.super__Rb_tree_header._M_node_count;
    } while (p_Var10 != (_Rb_tree_node_base *)&port_names);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&sinks._M_h._M_single_bucket);
  return;
}

Assistant:

void visit(Generator* gen) override {
        auto const* parent_gen = gen->parent_generator();
        auto port_names = gen->get_port_names();
        for (auto const& port_name : port_names) {
            auto const& port = gen->get_port(port_name);
            if (port->port_direction() != PortDirection::In) continue;
            auto sinks = std::unordered_set(port->sinks().begin(), port->sinks().end());
            for (auto const& stmt : sinks) {
                if (stmt->generator_parent() != parent_gen) continue;
                // if we have any sinks that's in the parent scope, it's an illegal assignment
                // we have to figure out the source
                auto const& sources = port->sources();
                if (sources.empty()) continue;
                auto const& src = (*sources.begin())->right()->shared_from_this();
                if (src->generator() != parent_gen)
                    throw InternalException("Invalid src generator");
                // replace the source with this src
                // depends on the context, it could be an auxiliary stmt
                if (port->generator()->is_auxiliary_var(stmt->left()->shared_from_this())) {
                    auto* parent_stmt = reinterpret_cast<Stmt*>(stmt->parent());
                    if (parent_stmt->type() == StatementType::If) {
                        auto if_ = parent_stmt->as<IfStmt>();
                        if (if_->predicate()->type() == VarType::Expression) {
                            auto expr = if_->predicate()->as<Expr>();
                            change_var_expr(expr, port.get(), src.get(), false);
                        } else {
                            if_->set_predicate(src);
                        }
                    } else {
                        // case statement
                        auto case_ = parent_stmt->as<SwitchStmt>();
                        if (case_->target()->type() == VarType::Expression) {
                            auto expr = case_->target()->as<Expr>();
                            change_var_expr(expr, port.get(), src.get(), false);
                        } else {
                            case_->set_target(src);
                        }
                    }
                } else {
                    auto* right = stmt->right();
                    if (right->type() == VarType::Expression) {
                        auto expr = right->as<Expr>();
                        change_var_expr(expr, port.get(), src.get(), false);
                    } else {
                        stmt->right() = src.get();
                    }
                }
            }
        }
    }